

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_page.cpp
# Opt level: O0

void __thiscall http::Page::Process(Page *this,char *htmlFile,char *marker,MarkerContent content)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  ostream *poVar3;
  char ch;
  ostream *out;
  int local_38;
  int markerLength;
  int markerIndex;
  int c;
  FILE *f;
  MarkerContent content_local;
  char *marker_local;
  char *htmlFile_local;
  Page *this_local;
  
  __stream = fopen(htmlFile,"r");
  if (__stream == (FILE *)0x0) {
    printf("failed to open file \'%s\'\n",htmlFile);
  }
  else {
    local_38 = 0;
    sVar2 = strlen(marker);
    poVar3 = get_output_stream(this);
    while (iVar1 = fgetc(__stream), 0 < iVar1) {
      if (iVar1 == marker[local_38]) {
        local_38 = local_38 + 1;
        if (local_38 == (int)sVar2) {
          local_38 = 0;
          std::operator<<(poVar3,"<!-- ");
          std::operator<<(poVar3,marker);
          std::operator<<(poVar3," start -->");
          (*content)(this);
          std::operator<<(poVar3,"<!-- ");
          std::operator<<(poVar3,marker);
          std::operator<<(poVar3," end -->");
        }
      }
      else if (local_38 < 1) {
        std::operator<<(poVar3,(char)iVar1);
      }
      else {
        std::ostream::write((char *)poVar3,(long)marker);
        local_38 = 0;
      }
    }
  }
  return;
}

Assistant:

void http::Page::Process(const char* htmlFile, const char* marker, MarkerContent content)
{
    FILE* f = fopen(htmlFile, "r");
    if (f)
    {
        int c;
        int markerIndex = 0;
        int markerLength = strlen(marker);
        std::ostream& out = get_output_stream();
        while ((c = fgetc(f)) > 0)
        {
            if (c == marker[markerIndex])
            {
                markerIndex++;
                if (markerIndex == markerLength)
                {
                    // found the marker
                    markerIndex = 0;
                    out << "<!-- ";
                    out << marker;
                    out << " start -->";
                    content(this);
                    out << "<!-- ";
                    out << marker;
                    out << " end -->";
                }
            }
            else if (markerIndex > 0)
            {
                // Send the part of the marker that matched so far
                out.write(marker, markerIndex);
                markerIndex = 0;
            }
            else
            {
                char ch = c;
                out << ch;
            }
        }
    }
    else
    {
        printf("failed to open file '%s'\n", htmlFile);
    }
}